

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

bool testing::internal::UnitTestOptions::FilterMatchesTest
               (string *test_suite_name,string *test_name)

{
  pointer pcVar1;
  bool bVar2;
  long *plVar3;
  char *pcVar4;
  size_t sVar5;
  size_type *psVar6;
  char *pcVar7;
  string *this;
  string str;
  string positive;
  string negative;
  long *local_d0 [2];
  long local_c0 [2];
  string local_b0;
  char *local_90;
  long local_88;
  char local_80;
  undefined7 uStack_7f;
  long *local_70 [2];
  long local_60 [2];
  char *local_50;
  char *local_48;
  char local_40;
  undefined7 uStack_3f;
  
  pcVar1 = (test_suite_name->_M_dataplus)._M_p;
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_d0,pcVar1,pcVar1 + test_suite_name->_M_string_length);
  std::__cxx11::string::append((char *)local_d0);
  plVar3 = (long *)std::__cxx11::string::append((char *)local_d0);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  psVar6 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_b0.field_2._M_allocated_capacity = *psVar6;
    local_b0.field_2._8_8_ = plVar3[3];
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar6;
    local_b0._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_b0._M_string_length = plVar3[1];
  *plVar3 = (long)psVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0],local_c0[0] + 1);
  }
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_d0,FLAGS_gtest_filter_abi_cxx11_,
             DAT_007e0fb8 + FLAGS_gtest_filter_abi_cxx11_);
  plVar3 = local_d0[0];
  pcVar4 = strchr((char *)local_d0[0],0x2d);
  local_90 = &local_80;
  local_88 = 0;
  local_80 = '\0';
  local_48 = (char *)0x0;
  local_40 = '\0';
  local_50 = &local_40;
  if (pcVar4 == (char *)0x0) {
    strlen((char *)plVar3);
    std::__cxx11::string::_M_replace((ulong)&local_90,0,(char *)0x0,(ulong)plVar3);
    pcVar7 = anon_var_dwarf_3f49e9 + 0x11;
    this = (string *)&local_50;
    pcVar4 = local_48;
  }
  else {
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,plVar3,pcVar4);
    this = (string *)&local_90;
    std::__cxx11::string::operator=(this,(string *)local_70);
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    local_70[0] = local_60;
    sVar5 = strlen(pcVar4 + 1);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_70,pcVar4 + 1,pcVar4 + sVar5 + 1);
    std::__cxx11::string::operator=((string *)&local_50,(string *)local_70);
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    if (local_88 != 0) goto LAB_0030bc4a;
    pcVar7 = "*";
    pcVar4 = (char *)0x0;
  }
  std::__cxx11::string::_M_replace((ulong)this,0,pcVar4,(ulong)pcVar7);
LAB_0030bc4a:
  pcVar4 = local_90;
  bVar2 = MatchesFilter(&local_b0,local_90);
  pcVar7 = local_50;
  if (bVar2) {
    bVar2 = MatchesFilter(&local_b0,local_50);
    bVar2 = !bVar2;
  }
  else {
    bVar2 = false;
  }
  if (pcVar7 != &local_40) {
    operator_delete(pcVar7,CONCAT71(uStack_3f,local_40) + 1);
    pcVar4 = local_90;
  }
  if (pcVar4 != &local_80) {
    operator_delete(pcVar4,CONCAT71(uStack_7f,local_80) + 1);
  }
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0],local_c0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool UnitTestOptions::FilterMatchesTest(const std::string& test_suite_name,
                                        const std::string& test_name) {
  const std::string& full_name = test_suite_name + "." + test_name.c_str();

  // Split --gtest_filter at '-', if there is one, to separate into
  // positive filter and negative filter portions
  std::string str = GTEST_FLAG_GET(filter);
  const char* const p = str.c_str();
  const char* const dash = strchr(p, '-');
  std::string positive;
  std::string negative;
  if (dash == nullptr) {
    positive = str.c_str();  // Whole string is a positive filter
    negative = "";
  } else {
    positive = std::string(p, dash);   // Everything up to the dash
    negative = std::string(dash + 1);  // Everything after the dash
    if (positive.empty()) {
      // Treat '-test1' as the same as '*-test1'
      positive = kUniversalFilter;
    }
  }

  // A filter is a colon-separated list of patterns.  It matches a
  // test if any pattern in it matches the test.
  return (MatchesFilter(full_name, positive.c_str()) &&
          !MatchesFilter(full_name, negative.c_str()));
}